

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O3

bool __thiscall
Ptex::v2_2::PtexUtils::anon_unknown_1::CompareRfaceIds::operator()
          (CompareRfaceIds *this,uint32_t faceid1,uint32_t faceid2)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  char cVar3;
  char cVar4;
  
  puVar1 = (undefined4 *)((long)this + (ulong)faceid2 * 0x14);
  cVar3 = '\x01';
  if ((*(byte *)((long)this + (ulong)faceid1 * 0x14 + 3) & 1) == 0) {
    puVar2 = (undefined4 *)((long)this + (ulong)faceid1 * 0x14);
    cVar3 = *(char *)((long)puVar2 + 1);
    cVar4 = (char)*puVar2;
    if (cVar4 < cVar3) {
      cVar3 = cVar4;
    }
  }
  cVar4 = '\x01';
  if ((*(byte *)((long)puVar1 + 3) & 1) == 0) {
    cVar4 = *(char *)((long)puVar1 + 1);
    if ((char)*puVar1 < *(char *)((long)puVar1 + 1)) {
      cVar4 = (char)*puVar1;
    }
  }
  return cVar4 < cVar3;
}

Assistant:

bool operator() (uint32_t faceid1, uint32_t faceid2)
        {
            const Ptex::FaceInfo& f1 = faces[faceid1];
            const Ptex::FaceInfo& f2 = faces[faceid2];
            int min1 = f1.isConstant() ? 1 : PtexUtils::min(f1.res.ulog2, f1.res.vlog2);
            int min2 = f2.isConstant() ? 1 : PtexUtils::min(f2.res.ulog2, f2.res.vlog2);
            return min1 > min2;
        }